

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v8::detail::format_float<double>
              (double value,int precision,float_specs specs,buffer<char> *buf)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  buffer<char> *pbVar4;
  result rVar5;
  int iVar6;
  detail *pdVar7;
  long lVar8;
  decimal_fp<float> dVar9;
  format_error *this;
  byte bVar10;
  undefined1 is_predecessor_closer;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  char cVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  size_t sVar20;
  ulong uVar21;
  uint64_t uVar22;
  bool bVar23;
  bool bVar24;
  float fVar25;
  fp value_00;
  decimal_fp<double> dVar26;
  int exp;
  gen_digits_handler handler;
  int local_90;
  gen_digits_handler local_88;
  buffer<char> *local_70;
  uint64_t local_68;
  detail *local_60;
  ulong local_58;
  ulong local_50;
  double local_48;
  ulong local_40;
  ulong local_38;
  
  uVar21 = (ulong)(uint)precision;
  local_38 = (ulong)specs & 0xff00000000;
  local_88.fixed = local_38 == 0x200000000;
  if (value <= 0.0) {
    if (0 < precision && local_38 == 0x200000000) {
      if (buf->capacity_ < uVar21) {
        (**buf->_vptr_buffer)(buf,uVar21);
      }
      uVar15 = buf->capacity_;
      if (uVar21 <= buf->capacity_) {
        uVar15 = uVar21;
      }
      buf->size_ = uVar15;
      memset(buf->ptr_,0x30,uVar21);
      return -precision;
    }
    if (buf->capacity_ < buf->size_ + 1) {
      (**buf->_vptr_buffer)(buf);
    }
    sVar20 = buf->size_;
    buf->size_ = sVar20 + 1;
    buf->ptr_[sVar20] = '0';
    return 0;
  }
  local_40 = (ulong)specs >> 0x20;
  if ((specs._4_4_ >> 0x13 & 1) != 0) {
    iVar18 = snprintf_float<double>(value,precision,specs,buf);
    return iVar18;
  }
  if (precision < 0) {
    if ((specs._4_4_ >> 0x12 & 1) == 0) {
      dVar26 = dragonbox::to_decimal<double>(value);
      write<char,_fmt::v8::appender,_unsigned_long,_0>((appender)buf,dVar26.significand);
      return dVar26.exponent;
    }
    dVar9 = dragonbox::to_decimal<float>((float)value);
    write<char,_fmt::v8::appender,_unsigned_int,_0>((appender)buf,dVar9.significand);
    return dVar9.exponent;
  }
  local_60 = (detail *)((ulong)value & 0xfffffffffffff);
  uVar13 = (uint)((ulong)value >> 0x34) & 0x7ff;
  local_58 = (ulong)uVar13;
  pdVar7 = (detail *)((ulong)local_60 | 0x10000000000000);
  if (uVar13 == 0) {
    pdVar7 = local_60;
  }
  uVar14 = uVar13 - 0x433;
  uVar12 = uVar14;
  if (uVar13 == 0) {
    lVar8 = 0x3f;
    if (local_60 != (detail *)0x0) {
      for (; (ulong)local_60 >> lVar8 == 0; lVar8 = lVar8 + -1) {
      }
    }
    pdVar7 = (detail *)((long)pdVar7 << (~(byte)lVar8 + 0x35 & 0x3f));
    uVar12 = 0xfffffbd9 - ((uint)lVar8 ^ 0x3f);
  }
  iVar18 = (int)((ulong)((long)(int)(-0x32 - uVar12) * 0x4d104d42 + 0xffffffff) >> 0x20);
  uVar11 = iVar18 + 0x15b;
  uVar13 = iVar18 + 0x162;
  if (-1 < (int)uVar11) {
    uVar13 = uVar11;
  }
  local_50 = (ulong)(uVar13 & 0xfffffff8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)pdVar7 << 0xb;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = basic_impl_data<void>::pow10_significands[(long)((int)uVar13 >> 3) + 1];
  uVar19 = SUB168(auVar2 * auVar3,8) - (SUB168(auVar2 * auVar3,0) >> 0x3f);
  bVar10 = -((char)basic_impl_data<void>::pow10_exponents[(long)((int)uVar13 >> 3) + 1] +
            (char)uVar12) - 0x35;
  uVar22 = 1L << (bVar10 & 0x3f);
  local_88.exp10 = 0x154 - (uVar13 & 0xfffffff8);
  uVar15 = uVar19 >> (bVar10 & 0x3f);
  uVar12 = (uint)uVar15 | 1;
  uVar13 = 0x1f;
  if (uVar12 != 0) {
    for (; uVar12 >> uVar13 == 0; uVar13 = uVar13 - 1) {
    }
  }
  lVar8 = (uVar15 & 0xffffffff) +
          *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar13 * 8);
  local_88.buf = buf->ptr_;
  local_88.size = 0;
  iVar18 = (int)((ulong)lVar8 >> 0x20);
  local_88.precision = precision;
  local_70 = buf;
  local_48 = value;
  if (local_38 == 0x200000000) {
    uVar13 = local_88.exp10 + iVar18;
    if ((int)(uVar13 ^ 0x7fffffff) < precision && 0 < (int)uVar13) {
      this = (format_error *)__cxa_allocate_exception(0x10);
      format_error::format_error(this,"number is too big");
      __cxa_throw(this,&format_error::typeinfo,format_error::~format_error);
    }
    local_88.precision = uVar13 + precision;
    if ((local_88.precision == 0 || SCARRY4(uVar13,precision) != local_88.precision < 0) &&
       (uVar21 = 1, local_88.precision >= 0)) {
      lVar8 = basic_impl_data<void>::power_of_10_64[lVar8 + -0x100000000 >> 0x20] << (bVar10 & 0x3f)
      ;
      uVar21 = uVar19 / 10;
      if ((lVar8 - uVar21 < uVar21) || (lVar8 + uVar21 * -2 < 0x14)) {
        if ((99 < uVar19) && (lVar8 - (uVar21 - 10) <= uVar21 - 10)) {
          cVar16 = '1';
          goto LAB_00171f92;
        }
        cVar16 = '0';
        bVar24 = true;
      }
      else {
        cVar16 = '0';
LAB_00171f92:
        bVar24 = false;
      }
      uVar21 = 2;
      if (!bVar24) {
        local_88.size = 1;
        *local_88.buf = cVar16;
        uVar21 = 1;
      }
    }
    iVar6 = (int)uVar21;
    if (local_88.precision < 1) goto LAB_00171ca7;
  }
  uVar1 = uVar22 - 1;
  uVar19 = uVar19 & uVar1;
  local_68 = uVar22;
  do {
    lVar8 = (long)iVar18;
    switch(iVar18) {
    case 1:
      cVar16 = (char)uVar15;
      uVar15 = 0;
      goto LAB_00171bfa;
    case 2:
      cVar16 = (char)((uVar15 & 0xffffffff) / 10);
      iVar6 = (int)((uVar15 & 0xffffffff) / 10) * 10;
      break;
    case 3:
      cVar16 = (char)((uVar15 & 0xffffffff) / 100);
      iVar6 = (int)((uVar15 & 0xffffffff) / 100) * 100;
      break;
    case 4:
      cVar16 = (char)((uVar15 & 0xffffffff) / 1000);
      iVar6 = (int)((uVar15 & 0xffffffff) / 1000) * 1000;
      break;
    case 5:
      cVar16 = (char)((uVar15 & 0xffffffff) / 10000);
      iVar6 = (int)((uVar15 & 0xffffffff) / 10000) * 10000;
      break;
    case 6:
      uVar17 = uVar15 >> 5 & 0x7ffffff;
      cVar16 = (char)(uVar17 / 0xc35);
      iVar6 = (int)(uVar17 / 0xc35) * 100000;
      break;
    case 7:
      cVar16 = (char)((uVar15 & 0xffffffff) / 1000000);
      iVar6 = (int)((uVar15 & 0xffffffff) / 1000000) * 1000000;
      break;
    case 8:
      cVar16 = (char)((uVar15 & 0xffffffff) / 10000000);
      iVar6 = (int)((uVar15 & 0xffffffff) / 10000000) * 10000000;
      break;
    case 9:
      cVar16 = (char)((uVar15 & 0xffffffff) / 100000000);
      iVar6 = (int)((uVar15 & 0xffffffff) / 100000000) * 100000000;
      break;
    case 10:
      uVar17 = (uVar15 >> 9 & 0x7fffff) * 0x44b83;
      cVar16 = (char)(uVar17 >> 0x27);
      iVar6 = (uint)(uVar17 >> 0x27) * 1000000000;
      break;
    default:
      cVar16 = '\0';
      goto LAB_00171bfa;
    }
    uVar15 = (ulong)(uint)((int)uVar15 - iVar6);
LAB_00171bfa:
    iVar18 = iVar18 + -1;
    rVar5 = gen_digits_handler::on_digit
                      (&local_88,cVar16 + '0',
                       *(long *)(basic_impl_data<void>::pow10_exponents + lVar8 * 4 + 0x54) <<
                       (bVar10 & 0x3f),((uVar15 & 0xffffffff) << (bVar10 & 0x3f)) + uVar19,1,true);
    if (rVar5 != more) {
      uVar21 = (ulong)rVar5;
    }
    iVar6 = (int)uVar21;
    if (rVar5 != more) goto LAB_00171ca7;
  } while (0 < iVar18);
  uVar22 = 1;
  do {
    uVar15 = uVar19 * 10;
    uVar22 = uVar22 * 10;
    uVar19 = uVar15 & uVar1;
    iVar18 = iVar18 + -1;
    rVar5 = gen_digits_handler::on_digit
                      (&local_88,(char)(uVar15 >> (bVar10 & 0x3f)) + '0',local_68,uVar19,uVar22,
                       false);
    if (rVar5 != more) {
      uVar21 = (ulong)rVar5;
    }
    iVar6 = (int)uVar21;
  } while (rVar5 == more);
LAB_00171ca7:
  pbVar4 = local_70;
  if (iVar6 == 2) {
    local_90 = local_88.precision;
    iVar18 = iVar18 + (local_88.size - ((int)local_50 + 8)) + 0x15b;
  }
  else {
    iVar18 = iVar18 + local_88.exp10;
    uVar21 = (ulong)(uint)local_88.size;
    if (local_70->capacity_ < uVar21) {
      (**local_70->_vptr_buffer)(local_70,uVar21);
    }
    if (pbVar4->capacity_ < uVar21) {
      uVar21 = pbVar4->capacity_;
    }
    pbVar4->size_ = uVar21;
    local_90 = precision;
  }
  uVar21 = local_38;
  uVar13 = (uint)local_40;
  if (iVar6 == 2) {
    if ((uVar13 >> 0x12 & 1) == 0) {
      uVar12 = (uint)local_58;
      pdVar7 = (detail *)((ulong)local_60 | 0x10000000000000);
      if (uVar12 == 0) {
        pdVar7 = local_60;
      }
      uVar11 = uVar14;
      if (uVar12 == 0) {
        uVar11 = 0xfffffbce;
      }
      uVar15 = (ulong)uVar11;
      bVar24 = local_60 == (detail *)0x0;
      bVar23 = uVar12 < 2;
    }
    else {
      fVar25 = (float)local_48;
      uVar12 = (uint)fVar25 & 0x7fffff;
      pdVar7 = (detail *)(ulong)uVar12 + 0x800000;
      if ((uint)fVar25 < 0x800000) {
        pdVar7 = (detail *)(ulong)uVar12;
      }
      uVar15 = 0xffffff6b;
      if ((uint)fVar25 >= 0x800000) {
        uVar15 = (ulong)(((uint)fVar25 >> 0x17) - 0x96);
      }
      bVar24 = uVar12 == 0;
      bVar23 = (uint)fVar25 < 0x1000000;
    }
    is_predecessor_closer = 0xff;
    if (local_90 < 0x2ff) {
      is_predecessor_closer = (undefined1)local_90;
    }
    value_00.e._0_1_ = !bVar23 & bVar24;
    value_00.f = uVar15;
    value_00._9_7_ = 0;
    format_dragon(pdVar7,value_00,(bool)is_predecessor_closer,(int)pbVar4,
                  (buffer<char> *)&stack0xffffffffffffff68,(int *)CONCAT44(uVar14,iVar18));
  }
  if ((uVar13 >> 0x14 & 1) == 0 && uVar21 != 0x200000000) {
    sVar20 = pbVar4->size_;
    if (sVar20 != 0) {
      do {
        iVar6 = iVar18 + 1;
        if (pbVar4->ptr_[sVar20 - 1] != '0') goto LAB_00171ee2;
        sVar20 = sVar20 - 1;
        iVar18 = iVar6;
      } while (sVar20 != 0);
      sVar20 = 0;
    }
LAB_00171ee2:
    if (pbVar4->capacity_ < sVar20) {
      (**pbVar4->_vptr_buffer)(pbVar4,sVar20);
    }
    if (pbVar4->capacity_ < sVar20) {
      sVar20 = pbVar4->capacity_;
    }
    pbVar4->size_ = sVar20;
  }
  return iVar18;
}

Assistant:

FMT_HEADER_ONLY_CONSTEXPR20 int format_float(Float value, int precision,
                                             float_specs specs,
                                             buffer<char>& buf) {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (specs.fallback) return snprintf_float(value, precision, specs, buf);

  if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  int exp = 0;
  bool use_dragon = true;
  if (is_fast_float<Float>()) {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = fp();
    bool is_predecessor_closer =
        specs.binary32 ? f.assign(static_cast<float>(value)) : f.assign(value);
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, is_predecessor_closer, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}